

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Sign,_4> *
deqp::gls::BuiltinPrecisionTests::
instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Sign,4>>
          (void)

{
  int iVar1;
  
  if (instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Sign,4>>()
      ::s_instance == '\0') {
    iVar1 = __cxa_guard_acquire(&instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Sign,4>>()
                                 ::s_instance);
    if (iVar1 != 0) {
      VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Sign,_4>::VectorizedFunc
                (&instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Sign,_4>_>
                  ::s_instance);
      __cxa_guard_release(&instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Sign,4>>()
                           ::s_instance);
    }
  }
  return &instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Sign,_4>_>
          ::s_instance;
}

Assistant:

const T& instance (void)
{
	static const T s_instance = T();
	return s_instance;
}